

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O3

pcp_errno pcp_db_foreach_server(pcp_ctx_t *ctx,pcp_db_server_iterate f,void *data)

{
  pcp_server_t *ppVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((ctx != (pcp_ctx_t *)0x0) && (f != (pcp_db_server_iterate)0x0)) {
    uVar4 = (ctx->pcp_db).pcp_servers_length;
    if (uVar4 != 0) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        ppVar1 = (ctx->pcp_db).pcp_servers;
        if (ppVar1[uVar5].server_state != pss_unitialized) {
          iVar3 = (*f)(ppVar1 + uVar5,data);
          if (iVar3 != 0) {
            return PCP_ERR_SUCCESS;
          }
          uVar4 = (ctx->pcp_db).pcp_servers_length;
        }
        bVar2 = uVar6 < uVar4;
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
    return PCP_ERR_MAX_SIZE;
  }
  __assert_fail("ctx && f",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0x174,"pcp_errno pcp_db_foreach_server(pcp_ctx_t *, pcp_db_server_iterate, void *)"
               );
}

Assistant:

pcp_errno pcp_db_foreach_server(pcp_ctx_t *ctx, pcp_db_server_iterate f,
                                void *data) {
    uint32_t indx;
    int ret = PCP_ERR_MAX_SIZE;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    assert(ctx && f);

    for (indx = 0; indx < ctx->pcp_db.pcp_servers_length; ++indx) {
        if (ctx->pcp_db.pcp_servers[indx].server_state == pss_unitialized) {
            continue;
        }
        if ((*f)(ctx->pcp_db.pcp_servers + indx, data)) {
            ret = PCP_ERR_SUCCESS;
            break;
        }
    }
    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return ret;
}